

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

void __thiscall
CLI::Option::Option(Option *this,string *option_name,string *option_description,callback_t *callback
                   ,App *parent,bool allow_non_standard)

{
  tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_e8;
  string local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  anon_class_1_0_00000001 local_32;
  byte local_31;
  App *pAStack_30;
  bool allow_non_standard_local;
  App *parent_local;
  callback_t *callback_local;
  string *option_description_local;
  string *option_name_local;
  Option *this_local;
  
  local_31 = allow_non_standard;
  pAStack_30 = parent;
  parent_local = (App *)callback;
  callback_local = (callback_t *)option_description;
  option_description_local = option_name;
  option_name_local = (string *)this;
  OptionBase<CLI::Option>::OptionBase(&this->super_OptionBase<CLI::Option>);
  (this->snames_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->snames_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->snames_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->snames_);
  (this->lnames_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lnames_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lnames_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->lnames_);
  (this->default_flag_values_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_flag_values_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->default_flag_values_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->default_flag_values_);
  (this->fnames_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fnames_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fnames_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->fnames_);
  ::std::__cxx11::string::string((string *)&this->pname_);
  ::std::__cxx11::string::string((string *)&this->envname_);
  ::std::__cxx11::string::string((string *)&this->description_,(string *)option_description);
  ::std::__cxx11::string::string((string *)&this->default_str_);
  ::std::__cxx11::string::string((string *)&this->option_text_);
  ::std::function<std::__cxx11::string()>::function<CLI::Option::type_name_::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)&this->type_name_,&local_32);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function(&this->default_function_);
  this->type_size_max_ = 1;
  this->type_size_min_ = 1;
  this->expected_min_ = 1;
  this->expected_max_ = 1;
  (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::vector(&this->validators_);
  (this->needs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->needs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->needs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->needs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->needs_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->needs_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::set
            (&this->needs_);
  (this->excludes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->excludes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->excludes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->excludes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->excludes_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->excludes_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::set
            (&this->excludes_);
  this->parent_ = pAStack_30;
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&this->callback_,callback);
  (this->results_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->results_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->results_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->results_);
  (this->proc_results_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->proc_results_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->proc_results_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->proc_results_);
  this->current_option_state_ = parsing;
  this->allow_extra_args_ = false;
  this->flag_like_ = false;
  this->run_callback_for_default_ = false;
  this->inject_separator_ = false;
  this->trigger_on_result_ = false;
  this->force_callback_ = false;
  ::std::__cxx11::string::string((string *)&local_c0,(string *)option_name);
  detail::split_names(&local_a0,&local_c0);
  detail::get_names(&local_88,&local_a0,(bool)(local_31 & 1));
  ::std::
  tie<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
            (&local_e8,&this->snames_,&this->lnames_,&this->pname_);
  ::std::
  tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&>
  ::operator=((tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&>
               *)&local_e8,&local_88);
  std::
  tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

Option(std::string option_name,
           std::string option_description,
           callback_t callback,
           App *parent,
           bool allow_non_standard = false)
        : description_(std::move(option_description)), parent_(parent), callback_(std::move(callback)) {
        std::tie(snames_, lnames_, pname_) = detail::get_names(detail::split_names(option_name), allow_non_standard);
    }